

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O1

boolean findtravelpath(_func_boolean_int_int *guess,schar *dx,schar *dy)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  bool bVar4;
  boolean bVar5;
  boolean bVar6;
  int iVar7;
  uint uVar8;
  uint y0;
  uint uVar9;
  uint x;
  int iVar10;
  int iVar11;
  long lVar12;
  obj *poVar13;
  uint uVar14;
  ulong uVar15;
  monst *worm;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  char cVar19;
  int *piVar20;
  long lVar21;
  long lVar22;
  undefined1 *puVar23;
  int iVar24;
  int x1;
  long lVar25;
  bool bVar26;
  xchar travelstepy [2] [1680];
  xchar travelstepx [2] [1680];
  uint travel [80] [21];
  uint local_3570;
  int local_356c;
  _func_boolean_int_int *local_3560;
  uint local_353c;
  uint local_3538;
  uint local_3530;
  char local_34b8 [3360];
  char local_2798 [3360];
  int local_1a78 [21];
  undefined1 local_1a24 [6644];
  
  if ((guess == (_func_boolean_int_int *)0x0) && (iflags.travel1 != '\0')) {
    iVar7 = distmin((int)u.ux,(int)u.uy,(int)u.tx,(int)u.ty);
    if (iVar7 == 1) {
      flags.run = 0;
      bVar5 = test_move((int)u.ux,(int)u.uy,(int)u.tx - (int)u.ux,(int)u.ty - (int)u.uy,0,1);
      if (bVar5 != '\0') {
        *dx = u.tx - u.ux;
        *dy = u.ty - u.uy;
        if (-1 < multi) {
          u._1052_1_ = u._1052_1_ & 0xef;
          u.usleep = 0;
          multi = 0;
          memset(multi_txt,0,0x100);
          flags.run = 0;
          flags.mv = '\0';
          iflags.travel1 = '\0';
          flags.travel = '\0';
        }
        iflags.travelcc.x = -1;
        iflags.travelcc.y = -1;
        return '\x01';
      }
      flags.run = 8;
    }
  }
  if (((u.tx != u.ux) || (guess == unexplored)) || (u.ty != u.uy)) {
    local_356c = u._0_4_;
    if (guess == (_func_boolean_int_int *)0x0) {
      local_356c = u._4_4_;
    }
    local_353c = (uint)(byte)u.ty;
    local_3570 = (uint)(byte)u.uy;
    local_3538 = u._4_4_;
    if (guess == (_func_boolean_int_int *)0x0) {
      local_353c = (uint)(byte)u.uy;
      local_3570 = (uint)(byte)u.ty;
      local_3538 = u._0_4_;
    }
    iVar7 = 1;
    uVar9 = 0;
    local_3530 = 1;
    bVar5 = '\x01';
    local_3560 = guess;
    do {
      memset(local_1a78,0,0x1a40);
      local_2798[0] = (char)local_356c;
      local_34b8[0] = (char)local_3570;
      uVar8 = (uint)(char)local_3538;
      y0 = (uint)(char)local_353c;
      while (local_3530 != 0) {
        if ((int)local_3530 < 1) {
          local_3530 = 0;
          uVar14 = local_3530;
        }
        else {
          uVar18 = 0;
          lVar12 = (ulong)(1 - uVar9) * 0x690;
          uVar14 = 0;
          do {
            cVar1 = local_2798[uVar18 + (ulong)uVar9 * 0x690];
            cVar2 = local_34b8[uVar18 + (ulong)uVar9 * 0x690];
            lVar22 = (ulong)(u.umonnum != 0x78) * 4 + 4;
            bVar4 = false;
            piVar20 = findtravelpath::ordered;
            do {
              iVar24 = (int)xdir[*piVar20];
              cVar19 = '\n';
              if ((iVar24 + cVar1) - 1U < 0x4f) {
                iVar17 = (int)""[*piVar20];
                uVar16 = iVar17 + cVar2;
                if (uVar16 < 0x15) {
                  x = iVar24 + cVar1;
                  uVar15 = (ulong)x;
                  if ((local_3560 != couldsee_func) || ((viz_array[uVar16][uVar15] & 1U) != 0)) {
                    worm = level->monsters[uVar15][uVar16];
                    if (worm == (monst *)0x0) {
                      worm = (monst *)0x0;
                    }
                    else if ((worm->field_0x61 & 2) != 0) {
                      worm = (monst *)0x0;
                    }
                    if (worm == (monst *)0x0) {
LAB_001a8b01:
                      bVar26 = false;
                    }
                    else {
                      if (worm->wormno == '\0') {
                        if (((viz_array[worm->my][worm->mx] & 2U) != 0) ||
                           (((((u.uprops[0x1e].intrinsic == 0 &&
                               ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                              (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                            (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                              (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                             (((viz_array[worm->my][worm->mx] & 1U) != 0 &&
                              ((worm->data->mflags3 & 0x200) != 0)))))))) goto LAB_001a893c;
LAB_001a898c:
                        if (((worm->data->mflags1 & 0x10000) == 0) &&
                           ((poVar13 = which_armor(worm,4), poVar13 == (obj *)0x0 ||
                            (poVar13 = which_armor(worm,4), poVar13->otyp != 0x4f)))) {
                          if (((u.uprops[0x1e].intrinsic != 0) ||
                              (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                               (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
                             (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
                              ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                                (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                                youmonst.data == mons + 0x32 && (u.uprops[0x19].blocked == 0))))))
                          goto LAB_001a8acc;
                          if ((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) {
                            iVar10 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy);
                            if (iVar10 < 0x41) goto LAB_001a8acc;
                          }
                        }
                        if (((u.uprops[0x42].intrinsic == 0) && (u.uprops[0x42].extrinsic == 0)) &&
                           (bVar6 = match_warn_of_mon(worm), bVar6 == '\0')) goto LAB_001a8b01;
                      }
                      else {
                        bVar6 = worm_known(level,worm);
                        if (bVar6 == '\0') goto LAB_001a898c;
LAB_001a893c:
                        uVar3 = *(uint *)&worm->field_0x60;
                        if ((((uVar3 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
                           (u.uprops[0xc].extrinsic == 0)) {
                          if (((uVar3 & 0x280) == 0) &&
                             (((youmonst.data)->mflags1 & 0x1000000) != 0)) goto LAB_001a897e;
                          goto LAB_001a898c;
                        }
                        if ((uVar3 & 0x280) != 0) goto LAB_001a898c;
LAB_001a897e:
                        if ((u._1052_1_ & 0x20) != 0) goto LAB_001a898c;
                      }
LAB_001a8acc:
                      if ((((byte)(worm->m_ap_type - 1) < 2) || ((worm->data->mflags1 & 0x100) != 0)
                          ) || ((char)*(uint *)&worm->field_0x60 < '\0')) goto LAB_001a8b01;
                      if (((*(uint *)&worm->field_0x60 >> 0x16 & 1) == 0) ||
                         (((bVar26 = true, u.uprops[0x23].intrinsic != 0 &&
                           (u.uprops[0x24].extrinsic == 0)) &&
                          ((u.umonnum == u.umonster ||
                           (bVar6 = dmgtype(youmonst.data,0x24), bVar6 == '\0')))))) {
                        iVar10 = noattacks(worm->data);
                        bVar26 = iVar10 != 0;
                      }
                    }
                    if ((((((u.uprops[0x3e].extrinsic == 0 && u.uprops[0x3e].intrinsic == 0) &&
                           (((youmonst.data)->mflags1 & 8) == 0)) &&
                          (bVar6 = can_ooze(&youmonst), bVar6 == '\0')) &&
                         (bVar6 = closed_door(level,x,uVar16), bVar6 != '\0')) ||
                        ((poVar13 = sobj_at(0x214,level,x,uVar16),
                         (bool)(poVar13 != (obj *)0x0 | bVar26) ||
                         (bVar6 = test_move((int)cVar1,(int)cVar2,iVar24,iVar17,0,3), bVar6 != '\0')
                         ))) && (iVar7 + -5 < local_1a78[(long)cVar1 * 0x15 + (long)cVar2])) {
                      if (!bVar4) {
                        local_2798[(int)uVar14 + lVar12] = cVar1;
                        local_34b8[(int)uVar14 + lVar12] = cVar2;
                        uVar14 = uVar14 + 1;
                      }
                      bVar4 = true;
                      cVar19 = '\n';
                    }
                    else {
                      bVar6 = test_move((int)cVar1,(int)cVar2,iVar24,iVar17,0,3);
                      if ((bVar6 == '\0') &&
                         (bVar6 = test_move((int)cVar1,(int)cVar2,iVar24,iVar17,0,2), bVar6 == '\0')
                         ) {
LAB_001a8e9e:
                        cVar19 = '\0';
                      }
                      else {
                        if (level->locations[uVar15][uVar16].seenv == '\0') {
                          if (((u.uprops[0x1e].intrinsic != 0) ||
                              (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                               (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
                             ((cVar19 = '\0', ublindf == (obj *)0x0 ||
                              (ublindf->oartifact != '\x1d')))) goto LAB_001a8ea1;
                          if ((viz_array[uVar16][uVar15] & 1U) == 0) goto LAB_001a8e9e;
                        }
                        if ((x == uVar8) && (uVar16 == y0)) {
                          if (local_3560 != (_func_boolean_int_int *)0x0) goto LAB_001a8e9e;
                          *dx = cVar1 - (char)local_3538;
                          *dy = cVar2 - (char)local_353c;
                          bVar5 = '\x01';
                          cVar19 = '\x01';
                          if ((cVar1 == u.tx) && (cVar2 == u.ty)) {
                            if (-1 < multi) {
                              u._1052_1_ = u._1052_1_ & 0xef;
                              u.usleep = 0;
                              multi = 0;
                              memset(multi_txt,0,0x100);
                              flags.mv = '\0';
                              iflags.travel1 = '\0';
                              flags.travel = '\0';
                            }
                            cVar19 = '\x01';
                            flags.run = 8;
                            iflags.travelcc.x = -1;
                            iflags.travelcc.y = -1;
                          }
                        }
                        else {
                          cVar19 = '\0';
                          if (local_1a78[uVar15 * 0x15 + (ulong)uVar16] == 0) {
                            local_2798[(int)uVar14 + lVar12] = (char)x;
                            local_34b8[(int)uVar14 + lVar12] = (char)uVar16;
                            local_1a78[uVar15 * 0x15 + (ulong)uVar16] = iVar7;
                            uVar14 = uVar14 + 1;
                          }
                        }
                      }
                    }
                  }
                }
              }
LAB_001a8ea1:
              if ((cVar19 != '\n') && (cVar19 != '\0')) goto LAB_001a8f16;
              piVar20 = piVar20 + 1;
              lVar22 = lVar22 + -1;
            } while (lVar22 != 0);
            cVar19 = '\0';
LAB_001a8f16:
            if (cVar19 != '\0') goto LAB_001a86c1;
            uVar18 = uVar18 + 1;
          } while (uVar18 != local_3530);
        }
        local_3530 = uVar14;
        uVar9 = 1 - uVar9;
        iVar7 = iVar7 + 1;
        cVar19 = '\0';
LAB_001a86c1:
        if (cVar19 != '\0') goto LAB_001a9299;
      }
      if (local_3560 == (_func_boolean_int_int *)0x0) {
        cVar19 = '\x01';
        bVar5 = '\0';
        break;
      }
      local_356c = (int)(char)local_356c;
      local_3570 = (uint)(char)local_3570;
      iVar17 = distmin(uVar8,y0,local_356c,local_3570);
      iVar24 = dist2(uVar8,y0,local_356c,local_3570);
      if (local_3560 == unexplored) {
        iVar24 = 0x7fffffff;
        iVar17 = 0x7fffffff;
      }
      lVar22 = 1;
      lVar12 = 0x13c;
      puVar23 = local_1a24;
      do {
        lVar25 = 0;
        lVar21 = lVar12;
        do {
          iVar10 = *(int *)(puVar23 + lVar25 * 4);
          if (iVar10 != 0) {
            x1 = (int)lVar22;
            uVar14 = (uint)lVar25;
            iVar11 = distmin(uVar8,y0,x1,uVar14);
            if (local_3560 == unexplored) {
              uVar16 = *(uint *)(level->levname + lVar21);
              iVar11 = iVar10;
              if (((uVar16 & 0x3f) != 0x26 && (uVar16 & 0x1ff800) == 0) &&
                 ((0x24 < (uVar16 & 0x3e) || ((0x1500000000U >> (uVar16 & 0x3e) & 1) == 0)))) {
                if (((uVar16 & 0x3f) - 0x1b < 2) ||
                   ((*(uint *)(level->levname + lVar21 + 6) & 0x3f0000) == 0)) {
                  iVar11 = iVar10 * 10;
                }
                else {
                  iVar11 = iVar10 * 2;
                }
              }
            }
            if ((iVar11 == iVar17) && (bVar6 = (*local_3560)(x1,uVar14), bVar6 != '\0')) {
              iVar10 = dist2(uVar8,y0,x1,uVar14);
              if (iVar10 < iVar24) {
                local_3570 = uVar14;
                local_356c = x1;
                iVar24 = iVar10;
              }
            }
            else if ((iVar11 < iVar17) && (bVar6 = (*local_3560)(x1,uVar14), bVar6 != '\0')) {
              iVar24 = dist2(uVar8,y0,x1,uVar14);
              local_3570 = uVar14;
              local_356c = x1;
              iVar17 = iVar11;
            }
          }
          lVar25 = lVar25 + 1;
          lVar21 = lVar21 + 0xc;
        } while (lVar25 != 0x15);
        lVar22 = lVar22 + 1;
        puVar23 = puVar23 + 0x54;
        lVar12 = lVar12 + 0xfc;
      } while (lVar22 != 0x50);
      iVar24 = (int)u.ux;
      bVar4 = (int)u.uy == local_3570;
      bVar26 = local_356c == iVar24;
      if (bVar4 && bVar26) {
        iVar24 = sgn(u.tx - iVar24);
        *dx = (schar)iVar24;
        uVar8 = sgn((int)u.ty - (int)u.uy);
        *dy = (char)uVar8;
        if ((*dx == '\0') && ((uVar8 & 0xff) == 0)) {
          cVar19 = '\x01';
          local_356c = 0x50;
          local_3570 = 0x15;
          if (-1 < multi) {
            u._1052_1_ = u._1052_1_ & 0xef;
            u.usleep = 0;
            multi = 0;
            memset(multi_txt,0,0x100);
            flags.run = 0;
            flags.mv = '\0';
            iflags.travel1 = '\0';
            flags.travel = '\0';
          }
          local_3530 = 0;
          bVar5 = '\0';
        }
        else {
          local_3530 = 0;
          bVar6 = test_move((int)u.ux,(int)u.uy,(int)*dx,(int)(char)uVar8,0,1);
          if (bVar6 != '\0') {
            bVar5 = '\x01';
          }
          cVar19 = (bVar6 == '\0') * '\x10' + '\x01';
          local_356c = 0x50;
          local_3570 = 0x15;
        }
      }
      else {
        cVar19 = '\x02';
        uVar9 = 0;
        iVar7 = 1;
        local_3530 = 1;
        local_353c = (uint)(byte)u.uy;
        local_3538 = u._0_4_ & 0xff;
        local_3560 = (_func_boolean_int_int *)0x0;
      }
    } while (!bVar4 || !bVar26);
LAB_001a9299:
    if (cVar19 == '\x01') {
      return bVar5;
    }
  }
  *dx = '\0';
  *dy = '\0';
  if (-1 < multi) {
    u._1052_1_ = u._1052_1_ & 0xef;
    u.usleep = 0;
    multi = 0;
    memset(multi_txt,0,0x100);
    flags.run = 0;
    flags.mv = '\0';
    iflags.travel1 = '\0';
    flags.travel = '\0';
  }
  return '\0';
}

Assistant:

static boolean findtravelpath(boolean (*guess)(int, int), schar *dx, schar *dy)
{
    /* if travel to adjacent, reachable location, use normal movement rules */
    if (!guess && iflags.travel1 && distmin(u.ux, u.uy, u.tx, u.ty) == 1) {
	flags.run = 0;
	if (test_move(u.ux, u.uy, u.tx-u.ux, u.ty-u.uy, 0, TEST_MOVE)) {
	    *dx = u.tx-u.ux;
	    *dy = u.ty-u.uy;
	    nomul(0, NULL);
	    iflags.travelcc.x = iflags.travelcc.y = -1;
	    return TRUE;
	}
	flags.run = 8;
    }
    if (u.tx != u.ux || u.ty != u.uy || guess == unexplored) {
	unsigned travel[COLNO][ROWNO];
	xchar travelstepx[2][COLNO*ROWNO];
	xchar travelstepy[2][COLNO*ROWNO];
	xchar tx, ty, ux, uy;
	int n = 1;			/* max offset in travelsteps */
	int set = 0;			/* two sets current and previous */
	int radius = 1;			/* search radius */
	int i;

	/* If guessing, first find an "obvious" goal location.  The obvious
	 * goal is the position the player knows of, or might figure out
	 * (couldsee) that is closest to the target on a straight path.
	 */
	if (guess) {
	    tx = u.ux; ty = u.uy; ux = u.tx; uy = u.ty;
	} else {
	    tx = u.tx; ty = u.ty; ux = u.ux; uy = u.uy;
	}

    noguess:
	memset(travel, 0, sizeof(travel));
	travelstepx[0][0] = tx;
	travelstepy[0][0] = ty;

	while (n != 0) {
	    int nn = 0;

	    for (i = 0; i < n; i++) {
		int dir;
		int x = travelstepx[set][i];
		int y = travelstepy[set][i];
		static const int ordered[] = { 0, 2, 4, 6, 1, 3, 5, 7 };
		/* no diagonal movement for grid bugs */
		int dirmax = u.umonnum == PM_GRID_BUG ? 4 : 8;
		boolean alreadyrepeated = FALSE;

		for (dir = 0; dir < dirmax; ++dir) {
		    const struct monst *mtmp;
		    boolean divert_mon;
		    int nx = x+xdir[ordered[dir]];
		    int ny = y+ydir[ordered[dir]];

		    /*
		     * When guessing and trying to travel as close as possible
		     * to an unreachable target space, don't include spaces
		     * that would never be picked as a guessed target in the
		     * travel matrix describing player-reachable spaces.
		     * This stops travel from getting confused and moving the
		     * player back and forth in certain degenerate configurations
		     * of sight-blocking obstacles, e.g.
		     *
		     *    T         1. Dig this out and carry enough to not be
		     *      ####       able to squeeze through diagonal gaps.
		     *      #--.---    Stand at @ and target travel at space T.
		     *       @.....
		     *       |.....
		     *
		     *    T         2. couldsee() marks spaces marked a and x as
		     *      ####       eligible guess spaces to move the player
		     *      a--.---    towards.  Space a is closest to T, so it gets
		     *       @xxxxx    chosen.  Travel system moves @ right to travel
		     *       |xxxxx    to space a.
		     *
		     *    T         3. couldsee() marks spaces marked b, c and x
		     *      ####       as eligible guess spaces to move the player
		     *      a--c---    towards.  Since findtravelpath() is called
		     *       b@xxxx    repeatedly during travel, it doesn't remember
		     *       |xxxxx    that it wanted to go to space a, so in
		     *                 comparing spaces b and c, b is chosen, since
		     *                 it seems like the closest eligible space to T.
		     *                 Travel system moves @ left to go to space b.
		     *
		     *              4. Go to 2.
		     *
		     * By limiting the travel matrix here, space a in the example
		     * above is never included in it, preventing the cycle.
		     */
		    if (!isok(nx, ny) || (guess == couldsee_func && !guess(nx, ny)))
			continue;

		    /* Walk around monsters that just get in the way. */
		    mtmp = m_at(level, nx, ny);
		    divert_mon = (mtmp &&
				  /* can be seen or spotted */
				  canspotmon(level, mtmp) &&
				  mtmp->m_ap_type != M_AP_FURNITURE &&
				  mtmp->m_ap_type != M_AP_OBJECT &&
				  !(is_hider(mtmp->data) || mtmp->mundetected) &&
				  /* peaceful monsters */
				  ((mtmp->mpeaceful && !Hallucination) ||
				   /* monsters with no attacks */
				   noattacks(mtmp->data)));

		    if ((!Passes_walls && !can_ooze(&youmonst) &&
			 closed_door(level, nx, ny)) ||
			sobj_at(BOULDER, level, nx, ny) ||
			divert_mon ||
			test_move(x, y, nx-x, ny-y, 0, TEST_TRAP)) {
			/* closed doors and boulders usually
			 * cause a delay, so prefer another path */
			if ((int)travel[x][y] > radius-5) {
			    if (!alreadyrepeated) {
				travelstepx[1-set][nn] = x;
				travelstepy[1-set][nn] = y;
				/* don't change travel matrix! */
				nn++;
				alreadyrepeated = TRUE;
			    }
			    continue;
			}
		    }
		    if (test_move(x, y, nx-x, ny-y, 0, TEST_TRAP) ||
			test_move(x, y, nx-x, ny-y, 0, TEST_TRAV)) {
			if (level->locations[nx][ny].seenv ||
			    (!Blind && couldsee(nx, ny))) {
			    if (nx == ux && ny == uy) {
				if (!guess) {
				    *dx = x-ux;
				    *dy = y-uy;
				    if (x == u.tx && y == u.ty) {
					nomul(0, NULL);
					/* reset run so domove run checks work */
					flags.run = 8;
					iflags.travelcc.x = iflags.travelcc.y = -1;
				    }
				    return TRUE;
				}
			    } else if (!travel[nx][ny]) {
				travelstepx[1-set][nn] = nx;
				travelstepy[1-set][nn] = ny;
				travel[nx][ny] = radius;
				nn++;
			    }
			}
		    }
		}
	    }

	    n = nn;
	    set = 1-set;
	    radius++;
	}

	/* if guessing, find best location in travel matrix and go there */
	if (guess) {
	    int px = tx, py = ty;	/* pick location */
	    int dist, nxtdist, d2, nd2;
	    boolean autoexploring = (guess == unexplored);

	    dist = distmin(ux, uy, tx, ty);
	    d2 = dist2(ux, uy, tx, ty);
	    if (autoexploring) {
		dist = INT_MAX;
		d2 = INT_MAX;
	    }
	    for (tx = 1; tx < COLNO; ++tx) {
		for (ty = 0; ty < ROWNO; ++ty) {
		    if (travel[tx][ty]) {
			nxtdist = distmin(ux, uy, tx, ty);
			if (autoexploring)
			    nxtdist = autotravel_weighting(tx, ty, travel[tx][ty]);
			if (nxtdist == dist && guess(tx, ty)) {
			    nd2 = dist2(ux, uy, tx, ty);
			    if (nd2 < d2) {
				/* prefer non-zigzag path */
				px = tx; py = ty;
				d2 = nd2;
			    }
			} else if (nxtdist < dist && guess(tx, ty)) {
			    px = tx; py = ty;
			    dist = nxtdist;
			    d2 = dist2(ux, uy, tx, ty);
			}
		    }
		}
	    }

	    if (px == u.ux && py == u.uy) {
		/* no guesses, just go in the general direction */
		*dx = sgn(u.tx - u.ux);
		*dy = sgn(u.ty - u.uy);
		if (*dx == 0 && *dy == 0) {
		    nomul(0, NULL);
		    return FALSE;
		}
		if (test_move(u.ux, u.uy, *dx, *dy, 0, TEST_MOVE))
		    return TRUE;
		goto found;
	    }
	    tx = px;
	    ty = py;
	    ux = u.ux;
	    uy = u.uy;
	    set = 0;
	    n = radius = 1;
	    guess = NULL;
	    goto noguess;
	}
	return FALSE;
    }

found:
    *dx = 0;
    *dy = 0;
    nomul(0, NULL);
    return FALSE;
}